

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.cpp
# Opt level: O0

bool __thiscall lzham::symbol_codec::put_bits(symbol_codec *this,uint bits,uint num_bits)

{
  bool bVar1;
  int in_EDX;
  uint in_ESI;
  long in_RDI;
  undefined7 in_stack_ffffffffffffffe0;
  
  if (in_EDX != 0) {
    *(int *)(in_RDI + 0x40) = *(int *)(in_RDI + 0x40) - in_EDX;
    *(ulong *)(in_RDI + 0x38) =
         (ulong)in_ESI << ((byte)*(undefined4 *)(in_RDI + 0x40) & 0x3f) | *(ulong *)(in_RDI + 0x38);
    *(int *)(in_RDI + 0x78) = in_EDX + *(int *)(in_RDI + 0x78);
    while (*(int *)(in_RDI + 0x40) < 0x39) {
      bVar1 = vector<unsigned_char>::try_push_back
                        ((vector<unsigned_char> *)CONCAT44(in_ESI,in_EDX),
                         (uchar *)CONCAT17((char)((ulong)*(undefined8 *)(in_RDI + 0x38) >> 0x38),
                                           in_stack_ffffffffffffffe0));
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        return false;
      }
      *(long *)(in_RDI + 0x38) = *(long *)(in_RDI + 0x38) << 8;
      *(int *)(in_RDI + 0x40) = *(int *)(in_RDI + 0x40) + 8;
    }
  }
  return true;
}

Assistant:

bool symbol_codec::put_bits(uint bits, uint num_bits)
   {
      LZHAM_ASSERT(num_bits <= 25);
      LZHAM_ASSERT(m_bit_count >= 25);

      if (!num_bits)
         return true;

      m_bit_count -= num_bits;
      m_bit_buf |= (static_cast<bit_buf_t>(bits) << m_bit_count);

      m_total_bits_written += num_bits;

      while (m_bit_count <= (cBitBufSize - 8))
      {
         if (!m_output_buf.try_push_back(static_cast<uint8>(m_bit_buf >> (cBitBufSize - 8))))
            return false;

         m_bit_buf <<= 8;
         m_bit_count += 8;
      }

      return true;
   }